

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O1

string * common_chat_format_single_abi_cxx11_
                   (string *__return_storage_ptr__,common_chat_templates *tmpls,
                   vector<common_chat_msg,_std::allocator<common_chat_msg>_> *past_msg,
                   common_chat_msg *new_msg,bool add_ass,bool use_jinja)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  string fmt_past_msg;
  string fmt_new_msg;
  common_chat_templates_inputs inputs;
  ostringstream ss;
  undefined1 *local_300;
  long local_2f8;
  undefined1 local_2f0;
  undefined7 uStack_2ef;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2e0;
  size_type local_2d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d0;
  common_chat_params local_2c0;
  common_chat_templates_inputs local_228;
  undefined1 local_1a8 [8];
  _Alloc_hider local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190;
  _Alloc_hider local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  vector<common_grammar_trigger,_std::allocator<common_grammar_trigger>_> local_158;
  undefined1 local_140 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_128 [10];
  
  local_228.grammar._M_dataplus._M_p = (pointer)&local_228.grammar.field_2;
  local_228.messages.super__Vector_base<common_chat_msg,_std::allocator<common_chat_msg>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_228.messages.super__Vector_base<common_chat_msg,_std::allocator<common_chat_msg>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_228.messages.super__Vector_base<common_chat_msg,_std::allocator<common_chat_msg>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_228.grammar._M_string_length = 0;
  local_228.grammar.field_2._M_local_buf[0] = '\0';
  paVar1 = &local_228.json_schema.field_2;
  local_228.json_schema._M_string_length = 0;
  local_228.json_schema.field_2._M_local_buf[0] = '\0';
  local_228.add_generation_prompt = true;
  local_228.tools.super__Vector_base<common_chat_tool,_std::allocator<common_chat_tool>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_228.tools.super__Vector_base<common_chat_tool,_std::allocator<common_chat_tool>_>._M_impl.
  super__Vector_impl_data._M_finish._0_5_ = 0;
  local_228.tools.super__Vector_base<common_chat_tool,_std::allocator<common_chat_tool>_>._M_impl.
  super__Vector_impl_data._M_finish._5_3_ = 0;
  local_228.tools.super__Vector_base<common_chat_tool,_std::allocator<common_chat_tool>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_5_ = 0;
  local_228._117_8_ = 0;
  local_228.extract_reasoning = true;
  local_300 = &local_2f0;
  local_2f8 = 0;
  local_2f0 = 0;
  local_228.json_schema._M_dataplus._M_p = (pointer)paVar1;
  local_228.use_jinja = use_jinja;
  if ((past_msg->super__Vector_base<common_chat_msg,_std::allocator<common_chat_msg>_>)._M_impl.
      super__Vector_impl_data._M_start !=
      (past_msg->super__Vector_base<common_chat_msg,_std::allocator<common_chat_msg>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    std::vector<common_chat_msg,_std::allocator<common_chat_msg>_>::operator=
              (&local_228.messages,past_msg);
    local_228.add_generation_prompt = false;
    common_chat_templates_apply((common_chat_params *)local_1a8,tmpls,&local_228);
    std::__cxx11::string::operator=((string *)&local_300,(string *)&local_1a0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(local_128);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_140);
    std::vector<common_grammar_trigger,_std::allocator<common_grammar_trigger>_>::~vector
              (&local_158);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180._M_p != &local_170) {
      operator_delete(local_180._M_p,local_170._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_p != &local_190) {
      operator_delete(local_1a0._M_p,local_190._M_allocated_capacity + 1);
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  if (((add_ass) && (local_2f8 != 0)) && (local_300[local_2f8 + -1] == '\n')) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  }
  std::vector<common_chat_msg,_std::allocator<common_chat_msg>_>::push_back
            (&local_228.messages,new_msg);
  local_228.add_generation_prompt = add_ass;
  common_chat_templates_apply(&local_2c0,tmpls,&local_228);
  paVar2 = &local_2c0.prompt.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0.prompt._M_dataplus._M_p == paVar2) {
    local_2d0._8_8_ = local_2c0.prompt.field_2._8_8_;
    local_2e0 = &local_2d0;
  }
  else {
    local_2e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2c0.prompt._M_dataplus._M_p;
  }
  local_2d0._M_allocated_capacity._1_7_ = local_2c0.prompt.field_2._M_allocated_capacity._1_7_;
  local_2d0._M_local_buf[0] = local_2c0.prompt.field_2._M_local_buf[0];
  local_2d8 = local_2c0.prompt._M_string_length;
  local_2c0.prompt._M_string_length = 0;
  local_2c0.prompt.field_2._M_local_buf[0] = '\0';
  local_2c0.prompt._M_dataplus._M_p = (pointer)paVar2;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2c0.additional_stops);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2c0.preserved_tokens);
  std::vector<common_grammar_trigger,_std::allocator<common_grammar_trigger>_>::~vector
            (&local_2c0.grammar_triggers);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0.grammar._M_dataplus._M_p != &local_2c0.grammar.field_2) {
    operator_delete(local_2c0.grammar._M_dataplus._M_p,
                    local_2c0.grammar.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0.prompt._M_dataplus._M_p != paVar2) {
    operator_delete(local_2c0.prompt._M_dataplus._M_p,
                    CONCAT71(local_2c0.prompt.field_2._M_allocated_capacity._1_7_,
                             local_2c0.prompt.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::string::substr((ulong)&local_2c0,(ulong)&local_2e0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,(char *)local_2c0._0_8_,(long)local_2c0.prompt._M_dataplus._M_p);
  if ((char *)local_2c0._0_8_ != (char *)((long)&local_2c0 + 0x10U)) {
    operator_delete((void *)local_2c0._0_8_,local_2c0.prompt._M_string_length + 1);
  }
  std::__cxx11::stringbuf::str();
  if (local_2e0 != &local_2d0) {
    operator_delete(local_2e0,local_2d0._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_140 + 8));
  if (local_300 != &local_2f0) {
    operator_delete(local_300,CONCAT71(uStack_2ef,local_2f0) + 1);
  }
  std::vector<common_chat_tool,_std::allocator<common_chat_tool>_>::~vector(&local_228.tools);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228.json_schema._M_dataplus._M_p != paVar1) {
    operator_delete(local_228.json_schema._M_dataplus._M_p,
                    CONCAT71(local_228.json_schema.field_2._M_allocated_capacity._1_7_,
                             local_228.json_schema.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228.grammar._M_dataplus._M_p != &local_228.grammar.field_2) {
    operator_delete(local_228.grammar._M_dataplus._M_p,
                    CONCAT71(local_228.grammar.field_2._M_allocated_capacity._1_7_,
                             local_228.grammar.field_2._M_local_buf[0]) + 1);
  }
  std::vector<common_chat_msg,_std::allocator<common_chat_msg>_>::~vector(&local_228.messages);
  return __return_storage_ptr__;
}

Assistant:

std::string common_chat_format_single(
        const struct common_chat_templates * tmpls,
        const std::vector<common_chat_msg> & past_msg,
        const common_chat_msg & new_msg,
        bool add_ass,
        bool use_jinja) {

    common_chat_templates_inputs inputs;
    inputs.use_jinja = use_jinja;

    std::string fmt_past_msg;
    if (!past_msg.empty()) {
        inputs.messages = past_msg;
        inputs.add_generation_prompt = false;
        fmt_past_msg = common_chat_templates_apply(tmpls, inputs).prompt;
    }
    std::ostringstream ss;
    // if the past_msg ends with a newline, we must preserve it in the formatted version
    if (add_ass && !fmt_past_msg.empty() && fmt_past_msg.back() == '\n') {
        ss << "\n";
    };
    // format chat with new_msg
    inputs.messages.push_back(new_msg);
    inputs.add_generation_prompt = add_ass;
    auto fmt_new_msg = common_chat_templates_apply(tmpls, inputs).prompt;
    // get the diff part
    ss << fmt_new_msg.substr(fmt_past_msg.size(), fmt_new_msg.size() - fmt_past_msg.size());
    return ss.str();
}